

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cc
# Opt level: O0

void re2c::prtCh(ostream *o,uint32_t c)

{
  opt_t *poVar1;
  char *pcVar2;
  bool bVar3;
  bool dot;
  uint32_t c_local;
  ostream *o_local;
  
  poVar1 = Opt::operator->((Opt *)&opts);
  bVar3 = poVar1->target == DOT;
  switch(c) {
  case 7:
    pcVar2 = "\\a";
    if (bVar3) {
      pcVar2 = "\\\\a";
    }
    std::operator<<(o,pcVar2);
    break;
  case 8:
    pcVar2 = "\\b";
    if (bVar3) {
      pcVar2 = "\\\\b";
    }
    std::operator<<(o,pcVar2);
    break;
  case 9:
    pcVar2 = "\\t";
    if (bVar3) {
      pcVar2 = "\\\\t";
    }
    std::operator<<(o,pcVar2);
    break;
  case 10:
    pcVar2 = "\\n";
    if (bVar3) {
      pcVar2 = "\\\\n";
    }
    std::operator<<(o,pcVar2);
    break;
  case 0xb:
    pcVar2 = "\\v";
    if (bVar3) {
      pcVar2 = "\\\\v";
    }
    std::operator<<(o,pcVar2);
    break;
  case 0xc:
    pcVar2 = "\\f";
    if (bVar3) {
      pcVar2 = "\\\\f";
    }
    std::operator<<(o,pcVar2);
    break;
  case 0xd:
    pcVar2 = "\\r";
    if (bVar3) {
      pcVar2 = "\\\\r";
    }
    std::operator<<(o,pcVar2);
    break;
  default:
    std::operator<<(o,(char)c);
    break;
  case 0x22:
    pcVar2 = "\"";
    if (bVar3) {
      pcVar2 = "\\\"";
    }
    std::operator<<(o,pcVar2);
    break;
  case 0x27:
    pcVar2 = "\\\'";
    if (bVar3) {
      pcVar2 = "\'";
    }
    std::operator<<(o,pcVar2);
    break;
  case 0x5c:
    std::operator<<(o,"\\\\");
  }
  return;
}

Assistant:

void prtCh(std::ostream& o, uint32_t c)
{
	const bool dot = opts->target == opt_t::DOT;

	switch (c)
	{
		case '\'':
		o << (dot ? "'" : "\\'");
		break;

		case '"':
		o << (dot ? "\\\"" : "\"");
		break;

		case '\n':
		o << (dot ? "\\\\n" : "\\n");
		break;

		case '\t':
		o << (dot ? "\\\\t" : "\\t");
		break;

		case '\v':
		o << (dot ? "\\\\v" : "\\v");
		break;

		case '\b':
		o << (dot ? "\\\\b" : "\\b");
		break;

		case '\r':
		o << (dot ? "\\\\r" : "\\r");
		break;

		case '\f':
		o << (dot ? "\\\\f" : "\\f");
		break;

		case '\a':
		o << (dot ? "\\\\a" :"\\a");
		break;

		case '\\':
		o << "\\\\"; // both .dot and C/C++ code expect "\\"
		break;

		default:
		o << static_cast<char> (c);
		break;
	}
}